

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Instruction_X86.h
# Opt level: O0

void __thiscall x86Argument::x86Argument(x86Argument *this,x86XmmReg xmmReg)

{
  x86XmmReg xmmReg_local;
  x86Argument *this_local;
  
  this->type = argXmmReg;
  (this->field_1).xmmArg = xmmReg;
  this->ptrBase = rNONE;
  this->ptrIndex = rNONE;
  this->ptrMult = 0;
  this->ptrNum = 0;
  return;
}

Assistant:

explicit x86Argument(x86XmmReg xmmReg)
	{
		this->type = argXmmReg;
		this->xmmArg = xmmReg;
		this->ptrBase = rNONE;
		this->ptrIndex = rNONE;
		this->ptrMult = 0;
		this->ptrNum = 0;
	}